

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

Index __thiscall
MADPComponentDiscreteObservations::GetObservationIndexByName
          (MADPComponentDiscreteObservations *this,string *s,Index agentI)

{
  bool bVar1;
  __type_conflict _Var2;
  undefined8 uVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pOVar6;
  E *this_00;
  uint in_EDX;
  string *in_RSI;
  long in_RDI;
  stringstream ss;
  string s2;
  const_iterator last;
  const_iterator it;
  stringstream ss_1;
  NamedDescribedEntity *in_stack_fffffffffffffbf8;
  E *in_stack_fffffffffffffc00;
  __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
  *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  stringstream local_380 [16];
  ostream local_370 [376];
  ObservationDiscrete *local_1f8;
  uint local_1ec;
  string local_1e8 [32];
  ObservationDiscrete *local_1c8;
  __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
  local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [396];
  uint local_1c;
  string *local_18;
  Index local_4;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
         in_stack_fffffffffffffc28);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  local_1c = in_EDX;
  local_18 = in_RSI;
  sVar4 = std::
          vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
          ::size((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x58));
  if (in_EDX < sVar4) {
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)local_1c);
    local_1c0._M_current =
         (ObservationDiscrete *)
         std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::begin
                   ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                    in_stack_fffffffffffffbf8);
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)local_1c);
    local_1c8 = (ObservationDiscrete *)
                std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::end
                          ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                           in_stack_fffffffffffffbf8);
    do {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                          *)in_stack_fffffffffffffc00,
                         (__normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                          *)in_stack_fffffffffffffbf8);
      if (!bVar1) {
        std::__cxx11::stringstream::stringstream(local_380);
        poVar5 = std::operator<<(local_370,"GetObservationIndexByName - observation \"");
        poVar5 = std::operator<<(poVar5,local_18);
        poVar5 = std::operator<<(poVar5,"\" of agent ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
        poVar5 = std::operator<<(poVar5," not found.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,(stringstream *)in_stack_fffffffffffffbf8);
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      __gnu_cxx::
      __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
      ::operator*(&local_1c0);
      NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffffbf8);
      _Var2 = std::operator==(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if (_Var2) {
        pOVar6 = __gnu_cxx::
                 __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                 ::operator*(&local_1c0);
        local_4 = DiscreteEntity::GetIndex(&pOVar6->super_DiscreteEntity);
      }
      else {
        local_1f8 = (ObservationDiscrete *)
                    __gnu_cxx::
                    __normal_iterator<const_ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                    ::operator++(in_stack_fffffffffffffc08,
                                 (int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      }
      local_1ec = (uint)_Var2;
      std::__cxx11::string::~string(local_1e8);
    } while (local_1ec == 0);
    return local_4;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar5 = std::operator<<(local_1a8,"GetObservationIndexByName -  Agent index (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
  poVar5 = std::operator<<(poVar5,") out of bounds! (_m_observationVecs contains observations");
  poVar5 = std::operator<<(poVar5," for ");
  sVar4 = std::
          vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
          ::size((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x58));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
  std::operator<<(poVar5," agents...)\n");
  uVar3 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffc00,(stringstream *)in_stack_fffffffffffffbf8);
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteObservations::GetObservationIndexByName(const string &s,
                                                                   Index agentI) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteObservations::GetObservationIndexByName - not initialized!");
    if(agentI >= _m_observationVecs.size())
    {
        stringstream ss;
        ss << "GetObservationIndexByName -  Agent index ("<<
            agentI<<") out of bounds! (_m_observationVecs contains observations"
            <<" for " << _m_observationVecs.size() << " agents...)\n";
        throw E(ss);
    }
    vector<ObservationDiscrete>::const_iterator it = 
    _m_observationVecs[agentI].begin();
    vector<ObservationDiscrete>::const_iterator last = 
    _m_observationVecs[agentI].end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    //return(-1);
    stringstream ss;
    ss << "GetObservationIndexByName - observation \"" << s << "\" of agent " <<
           agentI << " not found." << endl;
    throw E(ss);
}